

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::DeconvolutionDepthWise_x86_avx512::create_pipeline
          (DeconvolutionDepthWise_x86_avx512 *this,Option *opt)

{
  uint uVar1;
  int _h;
  int *piVar2;
  Allocator *pAVar3;
  void *pvVar4;
  uint uVar5;
  int iVar6;
  undefined4 *puVar7;
  undefined4 *puVar8;
  ulong uVar9;
  int iVar10;
  byte bVar11;
  int _w;
  ulong uVar12;
  Mat local_d8;
  Mat local_88;
  Mat *local_38;
  
  if ((this->super_DeconvolutionDepthWise).dynamic_weight != 0) {
    return 0;
  }
  uVar12 = (long)(this->super_DeconvolutionDepthWise).kernel_h *
           (long)(this->super_DeconvolutionDepthWise).kernel_w;
  uVar5 = (this->super_DeconvolutionDepthWise).num_output;
  uVar1 = (this->super_DeconvolutionDepthWise).group;
  uVar9 = (long)(this->super_DeconvolutionDepthWise).weight_data_size / (long)(int)uVar1;
  _w = (int)uVar12;
  uVar9 = (long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) / (long)_w;
  if ((uVar1 != uVar5) ||
     (uVar5 = (int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) /
                   (long)((int)uVar5 / (int)uVar1)) * uVar1, uVar5 != uVar1)) {
    create_group_ops(this,opt);
    if (opt->lightmode != true) {
      return 0;
    }
    piVar2 = (this->super_DeconvolutionDepthWise).weight_data.refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar4 = (this->super_DeconvolutionDepthWise).weight_data.data;
        pAVar3 = (this->super_DeconvolutionDepthWise).weight_data.allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (*pAVar3->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_DeconvolutionDepthWise).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_DeconvolutionDepthWise).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_DeconvolutionDepthWise).weight_data.elemsize + 4) = 0;
    (this->super_DeconvolutionDepthWise).weight_data.data = (void *)0x0;
    (this->super_DeconvolutionDepthWise).weight_data.refcount = (int *)0x0;
    (this->super_DeconvolutionDepthWise).weight_data.dims = 0;
    (this->super_DeconvolutionDepthWise).weight_data.w = 0;
    (this->super_DeconvolutionDepthWise).weight_data.h = 0;
    (this->super_DeconvolutionDepthWise).weight_data.d = 0;
    (this->super_DeconvolutionDepthWise).weight_data.c = 0;
    return 0;
  }
  bVar11 = 1;
  if (opt->use_packing_layout == true) {
    if ((uVar5 & 0xf) == 0) {
      bVar11 = 0x10;
    }
    else if ((uVar5 & 7) == 0) {
      bVar11 = 8;
    }
    else {
      bVar11 = ((uVar5 & 3) == 0) * '\x03' + 1;
    }
  }
  local_38 = &(this->super_DeconvolutionDepthWise).weight_data;
  local_88.cstep = 0;
  local_88.data = (Allocator *)0x0;
  local_88.refcount._0_4_ = 0;
  local_88.refcount._4_4_ = 0;
  local_88.elemsize._0_4_ = 0;
  local_88.elempack = 0;
  local_88._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  iVar10 = 0;
  local_88.elemsize._4_4_ = (int)local_88.refcount;
  local_88.allocator = (Allocator *)local_88.data;
  local_88.dims = (int)local_88.refcount;
  local_88.w = local_88.refcount._4_4_;
  local_88.c = local_88.elempack;
  Mat::create(&local_88,(this->super_DeconvolutionDepthWise).weight_data.w,4,(Allocator *)0x0);
  _h = (this->super_DeconvolutionDepthWise).group;
  iVar6 = (uVar5 - (int)uVar5 % _h) * ((this->super_DeconvolutionDepthWise).num_output / _h);
  if (0 < iVar6) {
    pvVar4 = local_38->data;
    puVar7 = (undefined4 *)((long)local_88.data + uVar12 * 4 + -4);
    do {
      if (0 < _w) {
        uVar9 = 0;
        puVar8 = puVar7;
        do {
          *puVar8 = *(undefined4 *)((long)pvVar4 + uVar9 * 4);
          uVar9 = uVar9 + 1;
          puVar8 = puVar8 + -1;
        } while ((uVar12 & 0xffffffff) != uVar9);
      }
      iVar10 = iVar10 + 1;
      pvVar4 = (void *)((long)pvVar4 + uVar12 * 4);
      puVar7 = puVar7 + uVar12;
    } while (iVar10 != iVar6);
  }
  if (7 < bVar11) {
    if (bVar11 != 8) {
      if (bVar11 == 0x10) {
        Mat::reshape(&local_d8,&local_88,_w,_h,(Allocator *)0x0);
        convert_packing(&local_d8,&this->weight_data_tm,0x10,opt);
        if (local_d8.refcount != (int *)0x0) {
          LOCK();
          *local_d8.refcount = *local_d8.refcount + -1;
          UNLOCK();
          if (*local_d8.refcount == 0) {
            if (local_d8.allocator == (Allocator *)0x0) {
              if (local_d8.data != (void *)0x0) {
                free(local_d8.data);
              }
            }
            else {
              (*(local_d8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      goto LAB_00471e39;
    }
    Mat::reshape(&local_d8,&local_88,_w,(this->super_DeconvolutionDepthWise).group,(Allocator *)0x0)
    ;
    convert_packing(&local_d8,&this->weight_data_tm,8,opt);
    if (local_d8.refcount != (int *)0x0) {
      LOCK();
      *local_d8.refcount = *local_d8.refcount + -1;
      UNLOCK();
      if (*local_d8.refcount == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (bVar11 == 1) {
    if (&this->weight_data_tm != &local_88) {
      piVar2 = (int *)CONCAT44(local_88.refcount._4_4_,(int)local_88.refcount);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = (this->weight_data_tm).refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          pvVar4 = (this->weight_data_tm).data;
          pAVar3 = (this->weight_data_tm).allocator;
          if (pAVar3 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (*pAVar3->_vptr_Allocator[3])();
          }
        }
      }
      (this->weight_data_tm).cstep = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
      (this->weight_data_tm).data = (void *)0x0;
      (this->weight_data_tm).refcount = (int *)0x0;
      (this->weight_data_tm).dims = 0;
      (this->weight_data_tm).w = 0;
      (this->weight_data_tm).h = 0;
      (this->weight_data_tm).d = 0;
      (this->weight_data_tm).c = 0;
      (this->weight_data_tm).data = local_88.data;
      (this->weight_data_tm).refcount =
           (int *)CONCAT44(local_88.refcount._4_4_,(int)local_88.refcount);
      (this->weight_data_tm).elemsize =
           CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
      (this->weight_data_tm).elempack = local_88.elempack;
      (this->weight_data_tm).allocator = local_88.allocator;
      (this->weight_data_tm).dims = local_88.dims;
      (this->weight_data_tm).w = local_88.w;
      (this->weight_data_tm).h = local_88.h;
      (this->weight_data_tm).d = local_88.d;
      (this->weight_data_tm).c = local_88.c;
      (this->weight_data_tm).cstep = local_88.cstep;
    }
  }
  else if (bVar11 == 4) {
    Mat::reshape(&local_d8,&local_88,_w,(this->super_DeconvolutionDepthWise).group,(Allocator *)0x0)
    ;
    convert_packing(&local_d8,&this->weight_data_tm,4,opt);
    if (local_d8.refcount != (int *)0x0) {
      LOCK();
      *local_d8.refcount = *local_d8.refcount + -1;
      UNLOCK();
      if (*local_d8.refcount == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
LAB_00471e39:
  if (opt->lightmode == true) {
    piVar2 = (this->super_DeconvolutionDepthWise).weight_data.refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar4 = (this->super_DeconvolutionDepthWise).weight_data.data;
        pAVar3 = (this->super_DeconvolutionDepthWise).weight_data.allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (*pAVar3->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_DeconvolutionDepthWise).weight_data.cstep = 0;
    *(undefined8 *)((long)&local_38->refcount + 4) = 0;
    *(undefined8 *)((long)&local_38->elemsize + 4) = 0;
    local_38->data = (void *)0x0;
    local_38->refcount = (int *)0x0;
    (this->super_DeconvolutionDepthWise).weight_data.dims = 0;
    (this->super_DeconvolutionDepthWise).weight_data.w = 0;
    (this->super_DeconvolutionDepthWise).weight_data.h = 0;
    (this->super_DeconvolutionDepthWise).weight_data.d = 0;
    (this->super_DeconvolutionDepthWise).weight_data.c = 0;
  }
  piVar2 = (int *)CONCAT44(local_88.refcount._4_4_,(int)local_88.refcount);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_88.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_88.data != (Allocator *)0x0) {
          free(local_88.data);
        }
      }
      else {
        (*(local_88.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int DeconvolutionDepthWise_x86_avx512::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < (channels / group) * (num_output / group) * group; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            weight_data_tm = weight_data_transposed;
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}